

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O0

int process_file(dump_option *opt)

{
  undefined8 uVar1;
  fdb_status fVar2;
  int iVar3;
  undefined8 *in_RDI;
  char *filename;
  fdb_status fs;
  fdb_kvs_name_list name_list;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int ret;
  int i;
  fdb_kvs_handle *in_stack_00000f88;
  fdb_kvs_handle *in_stack_fffffffffffffd98;
  undefined1 local_250 [24];
  char *in_stack_fffffffffffffdc8;
  dump_option *in_stack_fffffffffffffdd0;
  fdb_kvs_handle *in_stack_fffffffffffffdd8;
  fdb_kvs_name_list *in_stack_fffffffffffffde0;
  fdb_file_handle *in_stack_fffffffffffffde8;
  ulong local_148;
  long local_140;
  undefined1 local_120 [8];
  undefined8 local_118;
  undefined4 local_fc;
  fdb_kvs_config *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  fdb_kvs_handle **in_stack_ffffffffffffff50;
  fdb_file_handle *in_stack_ffffffffffffff58;
  fdb_config *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  fdb_file_handle **in_stack_ffffffffffffffc8;
  long local_28;
  long *local_20;
  int local_14;
  int local_4;
  
  uVar1 = *in_RDI;
  fdb_get_default_config();
  memcpy(local_120,local_250,0xf8);
  local_118 = 0;
  local_fc = 2;
  fVar2 = fdb_open(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if (((in_RDI[1] == 0) && (in_RDI[2] == 0)) &&
       (print_header(in_stack_00000f88), (*(byte *)((long)in_RDI + 0x21) & 1) != 0)) {
      local_4 = 0;
    }
    else {
      fdb_get_default_kvs_config();
      if ((*(byte *)(*local_20 + 0xb0) & 1) == 0) {
        fVar2 = fdb_kvs_open(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          printf("\nUnable to open KV store\n");
          return -3;
        }
        printf("\n");
        iVar3 = scan_docs(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                          in_stack_fffffffffffffdc8);
        if (iVar3 == -1) {
          printf("Key not found\n");
        }
        fdb_kvs_close(in_stack_fffffffffffffd98);
      }
      else {
        fdb_get_kvs_name_list(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        for (local_14 = 0; (ulong)(long)local_14 < local_148; local_14 = local_14 + 1) {
          if ((in_RDI[2] == 0) ||
             (iVar3 = strcmp((char *)in_RDI[2],*(char **)(local_140 + (long)local_14 * 8)),
             iVar3 == 0)) {
            fVar2 = fdb_kvs_open(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (*(long *)(local_28 + 8) == 0) {
                iVar3 = scan_docs(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                  in_stack_fffffffffffffdc8);
                if ((iVar3 == -1) && (in_RDI[2] != 0)) {
                  printf("KV store \'%s\': key not found\n",
                         *(undefined8 *)(local_140 + (long)local_14 * 8));
                }
                fdb_kvs_close(in_stack_fffffffffffffd98);
              }
              else {
                printf("\nUnable to dump KV store %s due to customized comparison function\n",
                       *(undefined8 *)(local_140 + (long)local_14 * 8));
                fdb_kvs_close(in_stack_fffffffffffffd98);
              }
            }
            else {
              printf("\nUnable to open KV store %s\n",
                     *(undefined8 *)(local_140 + (long)local_14 * 8));
            }
          }
        }
        fdb_free_kvs_name_list((fdb_kvs_name_list *)in_stack_fffffffffffffd98);
      }
      fVar2 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffd98);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        local_4 = 0;
      }
      else {
        printf("\nUnable to close %s\n",uVar1);
        local_4 = -4;
      }
    }
  }
  else {
    printf("\nUnable to open %s\n",uVar1);
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int process_file(struct dump_option *opt)
{
    int i, ret;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_name_list name_list;
    fdb_status fs;
    char *filename = opt->dump_file;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.flags = FDB_OPEN_FLAG_RDONLY;
    fs = fdb_open(&dbfile, filename, &config);
    if (fs != FDB_RESULT_SUCCESS) {
        printf("\nUnable to open %s\n", filename);
        return -3;
    }
    if (!opt->one_key && !opt->one_kvs) {
        // MB-22046: Avoid dumping header for specific kvs or specific key dump
        print_header(dbfile->root);
        if (opt->print_header_only) {
            return 0;
        }
    }

    kvs_config = fdb_get_default_kvs_config();

    if (dbfile->root->config.multi_kv_instances) {
        fdb_get_kvs_name_list(dbfile, &name_list);
        for (i=0; (uint64_t)i<name_list.num_kvs_names; ++i) {
            if (opt->one_kvs &&
                strcmp(opt->one_kvs, name_list.kvs_names[i])) {
                continue;
            }

            fs = fdb_kvs_open(dbfile, &db, name_list.kvs_names[i], &kvs_config);
            if (fs != FDB_RESULT_SUCCESS) {
                printf("\nUnable to open KV store %s\n", name_list.kvs_names[i]);
                continue;
            }
            if (db->kvs_config.custom_cmp) {
                printf("\nUnable to dump KV store %s due to "
                       "customized comparison function\n", name_list.kvs_names[i]);
                fdb_kvs_close(db);
                continue;
            }

            ret = scan_docs(db, opt, name_list.kvs_names[i]);
            if (ret == -1 && opt->one_kvs) {
                // Only print key not found if a specific key is accompanied by
                // a specific kv store.
                // Otherwise scan all kv stores for the same key..
                printf("KV store '%s': key not found\n", name_list.kvs_names[i]);
            }
            fdb_kvs_close(db);
        }

        fdb_free_kvs_name_list(&name_list);
    } else {
        fs = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to open KV store\n");
            return -3;
        }

        printf("\n");
        ret = scan_docs(db, opt, NULL);
        if (ret == -1) {
            printf("Key not found\n");
        }
        fdb_kvs_close(db);
    }

    fs = fdb_close(dbfile);
    if (fs != FDB_RESULT_SUCCESS) {
        printf("\nUnable to close %s\n", filename);
        return -4;
    }

    fdb_shutdown();
    return 0;
}